

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.h
# Opt level: O0

bool __thiscall
dg::vr::ValueRelations::has<dg::vr::Bucket>(ValueRelations *this,Bucket *val,Relations rels)

{
  bool bVar1;
  HandlePtr this_00;
  size_t sVar2;
  Relations *pRVar3;
  Handle in_RSI;
  HandlePtr mVal;
  undefined4 in_stack_ffffffffffffff98;
  Type in_stack_ffffffffffffff9c;
  reference_wrapper<const_dg::vr::Bucket> *in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 uVar4;
  
  this_00 = maybeGet(in_RSI);
  uVar4 = false;
  if (this_00 != (HandlePtr)0x0) {
    bVar1 = Relations::has((Relations *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    if (bVar1) {
      std::reference_wrapper<dg::vr::Bucket_const>::
      reference_wrapper<dg::vr::Bucket_const&,void,dg::vr::Bucket_const*>
                (in_stack_ffffffffffffffa0,
                 (Bucket *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      std::
      map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
      ::find((map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
              *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),(key_type *)0x1ec35e);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>
      ::operator->((_Rb_tree_const_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>
                    *)0x1ec36d);
      sVar2 = VectorSet<const_llvm::Value_*>::size((VectorSet<const_llvm::Value_*> *)0x1ec379);
      if (1 < sVar2) {
        return true;
      }
    }
    pRVar3 = Relations::set((Relations *)this_00,in_stack_ffffffffffffff9c,
                            SUB41((uint)in_stack_ffffffffffffff98 >> 0x18,0));
    uVar4 = Bucket::hasAnyRelation
                      ((Bucket *)CONCAT17(uVar4,in_stack_ffffffffffffffc0),
                       (Relations)(pRVar3->bits).super__Base_bitset<1UL>._M_w);
  }
  return (bool)uVar4;
}

Assistant:

bool has(const X &val, Relations rels) const {
        HandlePtr mVal = maybeGet(val);
        return mVal && ((rels.has(Relations::EQ) &&
                         bucketToVals.find(*mVal)->second.size() > 1) ||
                        mVal->hasAnyRelation(rels.set(Relations::EQ, false)));
    }